

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O1

int AF_A_WeaponOffset(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  uint uVar7;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  double wx;
  double wy;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0052e82f;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = (AActor *)(param->field_0).field_1.a;
    pVVar8 = param;
    uVar7 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (self->super_DThinker).super_DObject.Class;
      bVar9 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar7 = (uint)bVar9;
      pVVar8 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar9);
      if (pPVar6 != pPVar3 && !bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0052e82f;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_0052e804;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0052e82f;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      wx = 0.0;
      if (3 < numparam) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          wx = param[3].field_0.f;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x3f6,
                        "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      wy = 32.0;
      if (4 < numparam) {
        VVar1 = param[4].field_0.field_3.Type;
        if (VVar1 == '\x01') {
          wy = param[4].field_0.f;
        }
        else if (VVar1 != 0xff) {
          __assert_fail("param[paramnum].Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                        ,0x3f7,
                        "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
        }
      }
      iVar4 = 0;
      if (5 < numparam) {
        VVar1 = param[5].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar4 = param[5].field_0.i;
        }
        else {
          iVar4 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x3f8,
                          "int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
          }
        }
      }
      A_OverlayOffset(self,1,wx,wy,iVar4);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_0052e804:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0052e82f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                ,0x3f5,"int AF_A_WeaponOffset(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WeaponOffset)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_FLOAT_OPT(wx) { wx = 0.; }
	PARAM_FLOAT_OPT(wy) { wy = 32.; }
	PARAM_INT_OPT(flags) { flags = 0; }
	A_OverlayOffset(self, PSP_WEAPON, wx, wy, flags);
	return 0;
}